

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_se(bitstream *str,int32_t *val)

{
  int iVar1;
  uint32_t local_24;
  uint *puStack_20;
  uint32_t tmp;
  int32_t *val_local;
  bitstream *str_local;
  
  puStack_20 = (uint *)val;
  val_local = (int32_t *)str;
  if (str->dir == VS_ENCODE) {
    if (*val == -0x80000000) {
      fprintf(_stderr,"Exp-Golomb signed number equal to -2^31\n");
      str_local._4_4_ = 1;
    }
    else {
      if (*val < 1) {
        local_24 = *val * -2;
      }
      else {
        local_24 = *val * 2 - 1;
      }
      str_local._4_4_ = vs_ue(str,&local_24);
    }
  }
  else {
    iVar1 = vs_ue(str,&local_24);
    if (iVar1 == 0) {
      if ((local_24 & 1) == 0) {
        *puStack_20 = -(local_24 >> 1);
      }
      else {
        *puStack_20 = local_24 + 1 >> 1;
      }
      str_local._4_4_ = 0;
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int vs_se(struct bitstream *str, int32_t *val) {
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val == (int32_t)(-0x7fffffff-1)) {
			fprintf (stderr, "Exp-Golomb signed number equal to -2^31\n");
			return 1;
		}
		if (*val > 0) {
			tmp = *val * 2 - 1;
		} else {
			tmp = -*val * 2;
		}
		return vs_ue(str, &tmp);
	} else {
		if (vs_ue(str, &tmp))
			return 1;
		if (tmp & 1) {
			*val = (tmp + 1) >> 1;
		} else {
			*val = -(tmp >> 1);
		}
		return 0;
	}
}